

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<unsigned_long_const&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,unsigned_long *args)

{
  bool bVar1;
  char **format_str;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str_00;
  format_args args_00;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  unsigned_long *args_local;
  char *fmt_local;
  CfdSourceLocation *pCStack_90;
  CfdLogLevel lvl_local;
  CfdSourceLocation *source_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
  *vargs;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
  *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  message.field_2._8_8_ = args;
  args_local = (unsigned_long *)fmt;
  fmt_local._4_4_ = lvl;
  pCStack_90 = source;
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    local_40 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
                *)&args_local;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_long>
             *)message.field_2._8_8_;
    local_38 = (string *)local_c8;
    local_68.named_args.data =
         (named_arg_info<char> *)
         ::fmt::v7::make_args_checked<unsigned_long_const&,char_const*,char>
                   (local_40,(v7 *)message.field_2._8_8_,format_str,
                    (remove_reference_t<const_unsigned_long_&> *)local_40);
    local_50 = &local_68;
    local_78 = ::fmt::v7::to_string_view<char,_0>((local_40->data_).args_[0].field_0.string.data);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&source_local;
    local_30 = local_50;
    local_20 = local_50;
    local_10 = local_50;
    local_18 = local_28;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,4,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)&local_50->string);
    format_str_00.size_ = (size_t)source_local;
    format_str_00.data_ = (char *)local_78.size_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_80.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_c8,(detail *)local_78.data_,format_str_00,args_00);
    WriteLog(pCStack_90,fmt_local._4_4_,(string *)local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}